

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

bool __thiscall cmMessenger::IsMessageTypeVisible(cmMessenger *this,MessageType t)

{
  byte bVar1;
  
  bVar1 = true;
  switch(t) {
  case AUTHOR_WARNING:
    bVar1 = this->SuppressDevWarnings;
    break;
  case AUTHOR_ERROR:
    return this->DevWarningsAsErrors;
  default:
    goto switchD_003131d7_caseD_2;
  case DEPRECATION_ERROR:
    return this->DeprecatedWarningsAsErrors;
  case DEPRECATION_WARNING:
    bVar1 = this->SuppressDeprecatedWarnings;
  }
  bVar1 = bVar1 ^ 1;
switchD_003131d7_caseD_2:
  return (bool)bVar1;
}

Assistant:

bool cmMessenger::IsMessageTypeVisible(MessageType t) const
{
  if (t == MessageType::DEPRECATION_ERROR) {
    return this->GetDeprecatedWarningsAsErrors();
  }
  if (t == MessageType::DEPRECATION_WARNING) {
    return !this->GetSuppressDeprecatedWarnings();
  }
  if (t == MessageType::AUTHOR_ERROR) {
    return this->GetDevWarningsAsErrors();
  }
  if (t == MessageType::AUTHOR_WARNING) {
    return !this->GetSuppressDevWarnings();
  }

  return true;
}